

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.cpp
# Opt level: O0

bool fs_is_case_sensitive(string_view path)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __sv_type _Var2;
  undefined1 local_130 [8];
  string actual;
  undefined1 local_f0 [8];
  string lower;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string CamelCase;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string p;
  string rname;
  string_view path_local;
  
  rname.field_2._8_8_ = path._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&rname.field_2 + 8))
  ;
  if (bVar1) {
    path_local._M_str._7_1_ = false;
  }
  else {
    fs_generate_random_alphanumeric_string_abi_cxx11_((string *)((long)&p.field_2 + 8),0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_60,
               (basic_string_view<char,_std::char_traits<char>_> *)((long)&rname.field_2 + 8),
               &local_61);
    std::allocator<char>::~allocator(&local_61);
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "/.FfilesystemCaseSensitiveCheck_");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&p.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_b8);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
    bVar1 = fs_touch(_Var2);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_f0);
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      __result = std::back_inserter<std::__cxx11::string>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_f0);
      actual.field_2._8_8_ =
           std::
           transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,int(*)(int)noexcept>
                     (__first,__last,__result,tolower);
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f0);
      fs_canonical_abi_cxx11_((string *)local_130,_Var2,true,true);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&p.field_2 + 8));
      if (!bVar1) {
        _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
        fs_remove(_Var2);
      }
      path_local._M_str._7_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
      lower.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_f0);
    }
    else {
      path_local._M_str._7_1_ = false;
      lower.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(p.field_2._M_local_buf + 8));
  }
  return path_local._M_str._7_1_;
}

Assistant:

bool fs_is_case_sensitive(std::string_view path)
{
  // check if the filesystem is case sensitive
  if(path.empty())
    return false;

  const std::string rname = fs_generate_random_alphanumeric_string(16);
  std::string p(path);
  // create a temporary file with a unique name that has CamelCase
  const std::string CamelCase = p + "/.FfilesystemCaseSensitiveCheck_" + rname;

  if(!fs_touch(CamelCase))
    return false;

  std::string lower;
  std::transform(CamelCase.begin(), CamelCase.end(), std::back_inserter(lower), ::tolower);

  const std::string actual = fs_canonical(lower, true, true);

  if(!rname.empty())
    fs_remove(CamelCase);

  return actual == CamelCase;

}